

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O0

string * __thiscall
ApprovalTests::ApprovalTestNamer::getOutputFileBaseName_abi_cxx11_(ApprovalTestNamer *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  ApprovalTestNamer *in_stack_00000008;
  ApprovalTestNamer *in_stack_00000198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_80 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  string local_50 [32];
  string local_30 [48];
  
  __lhs = in_RDI;
  getSourceFileName_abi_cxx11_(in_stack_00000008);
  ::std::operator+(__lhs,(char *)in_RDI);
  getTestName_abi_cxx11_(in_stack_00000198);
  ::std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  ::std::__cxx11::string::~string(local_80);
  ::std::__cxx11::string::~string(local_30);
  ::std::__cxx11::string::~string(local_50);
  return __lhs;
}

Assistant:

std::string ApprovalTestNamer::getOutputFileBaseName() const
    {
        return getSourceFileName() + "." + getTestName();
    }